

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httppost.cpp
# Opt level: O0

void __thiscall
hbm::HttpPost::HttpPost(HttpPost *this,string *address,string *port,string *httpPath)

{
  ulong uVar1;
  runtime_error *prVar2;
  string *in_RCX;
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  std::__cxx11::string::string(in_RDI + 0x40,in_RCX);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"no stream server address provided");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      return;
    }
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"no stream server path id provided");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"no stream server control port provided");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

HttpPost::HttpPost(const std::string &address, const std::string &port, const std::string &httpPath)
		: m_address(address)
		, m_port(port)
		, m_httpPath(httpPath)
	{
		if(m_address.empty()) {
			throw std::runtime_error("no stream server address provided");
		}
		if(m_port.empty()) {
			throw std::runtime_error("no stream server control port provided");
		}
		if(m_httpPath.empty()) {
			throw std::runtime_error("no stream server path id provided");
		}

	}